

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O2

Var Js::ProfilingHelpers::ProfiledLdFld<true,false,false>
              (Var instance,PropertyId propertyId,InlineCache *inlineCache,
              InlineCacheIndex inlineCacheIndex,FunctionBody *functionBody,Var thisInstance)

{
  code *pcVar1;
  Var pvVar2;
  bool bVar3;
  FldInfoFlags FVar4;
  FldInfoFlags newFlags;
  uint uVar5;
  undefined4 *puVar6;
  ScriptContext *requestContext;
  RecyclableObject *object;
  undefined1 local_a8 [8];
  PropertyValueInfo propertyValueInfo;
  Var local_48;
  Var value;
  FldInfoFlags local_34;
  PropertyCacheOperationInfo local_33 [2];
  PropertyCacheOperationInfo operationInfo;
  
  value = inlineCache;
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3ae,"(instance)","instance");
    if (!bVar3) goto LAB_009dd6de;
    *puVar6 = 0;
  }
  if (thisInstance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3af,"(thisInstance)","thisInstance");
    if (!bVar3) goto LAB_009dd6de;
    *puVar6 = 0;
  }
  pvVar2 = value;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b0,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) goto LAB_009dd6de;
    *puVar6 = 0;
  }
  if (pvVar2 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b1,"(inlineCache)","inlineCache");
    if (!bVar3) goto LAB_009dd6de;
    *puVar6 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b2,"(functionBody)","functionBody");
    if (!bVar3) goto LAB_009dd6de;
    *puVar6 = 0;
  }
  uVar5 = FunctionBody::GetInlineCacheCount(functionBody);
  if (uVar5 <= inlineCacheIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b3,"(inlineCacheIndex < functionBody->GetInlineCacheCount())",
                                "inlineCacheIndex < functionBody->GetInlineCacheCount()");
    if (!bVar3) goto LAB_009dd6de;
    *puVar6 = 0;
  }
  uVar5 = FunctionBody::GetRootObjectLoadInlineCacheStart(functionBody);
  if (inlineCacheIndex < uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b4,
                                "(!Root || inlineCacheIndex >= functionBody->GetRootObjectLoadInlineCacheStart())"
                                ,
                                "!Root || inlineCacheIndex >= functionBody->GetRootObjectLoadInlineCacheStart()"
                               );
    if (!bVar3) {
LAB_009dd6de:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(instance);
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  propertyValueInfo._56_8_ = FunctionBody::GetDynamicProfileInfo(functionBody);
  local_34 = FldInfo_NoInfo;
  object = UnsafeVarTo<Js::RecyclableObject>(instance);
  UnsafeVarTo<Js::RecyclableObject>(thisInstance);
  local_33[0].cacheType = CacheType_None;
  local_33[0].slotType = SlotType_None;
  local_33[0].isPolymorphic = false;
  local_a8 = (undefined1  [8])0x0;
  propertyValueInfo.m_instance = (RecyclableObject *)0x50000ffff;
  propertyValueInfo.m_propertyIndex = 0;
  propertyValueInfo.m_attributes = '\0';
  propertyValueInfo.flags = InlineCacheNoFlags;
  propertyValueInfo.cacheInfoFlag = 0;
  propertyValueInfo.inlineCache = (InlineCache *)0x0;
  propertyValueInfo.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  propertyValueInfo.functionBody = (FunctionBody *)0x0;
  propertyValueInfo.prop = (RecyclableObject *)0x0;
  propertyValueInfo.propertyRecordUsageCache._0_4_ = 0xffffffff;
  propertyValueInfo.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_a8,functionBody,(InlineCache *)value,inlineCacheIndex,true);
  bVar3 = CacheOperators::TryGetProperty<true,true,true,false,true,false,true,false,true,false>
                    (object,true,object,propertyId,&local_48,requestContext,local_33,
                     (PropertyValueInfo *)local_a8);
  if (!bVar3) {
    local_48 = JavascriptOperators::PatchGetRootValueNoFastPath_Var
                         (functionBody,(InlineCache *)value,inlineCacheIndex,object,propertyId);
    CacheOperators::PretendTryGetProperty<true,false>
              ((object->type).ptr,local_33,(PropertyValueInfo *)local_a8);
  }
  FVar4 = DynamicProfileInfo::FldInfoFlagsFromCacheType(local_33[0].cacheType);
  FVar4 = DynamicProfileInfo::MergeFldInfoFlags(FldInfo_NoInfo,FVar4);
  newFlags = DynamicProfileInfo::FldInfoFlagsFromSlotType(local_33[0].slotType);
  local_34 = DynamicProfileInfo::MergeFldInfoFlags(FVar4,newFlags);
  UpdateFldInfoFlagsForGetSetInlineCandidate
            (object,&local_34,local_33[0].cacheType,(InlineCache *)value,functionBody);
  DynamicProfileInfo::RecordFieldAccess
            ((DynamicProfileInfo *)propertyValueInfo._56_8_,functionBody,inlineCacheIndex,local_48,
             local_34);
  return local_48;
}

Assistant:

Var ProfilingHelpers::ProfiledLdFld(
        const Var instance,
        const PropertyId propertyId,
        InlineCache *const inlineCache,
        const InlineCacheIndex inlineCacheIndex,
        FunctionBody *const functionBody,
        const Var thisInstance)
    {
        Assert(instance);
        Assert(thisInstance);
        Assert(propertyId != Constants::NoProperty);
        Assert(inlineCache);
        Assert(functionBody);
        Assert(inlineCacheIndex < functionBody->GetInlineCacheCount());
        Assert(!Root || inlineCacheIndex >= functionBody->GetRootObjectLoadInlineCacheStart());

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        ScriptContext *const scriptContext = functionBody->GetScriptContext();
        DynamicProfileInfo *const dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        Var value;
        FldInfoFlags fldInfoFlags = FldInfo_NoInfo;
        if (Root || (VarIs<RecyclableObject>(instance) && VarIs<RecyclableObject>(thisInstance)))
        {
            RecyclableObject *const object = UnsafeVarTo<RecyclableObject>(instance);
            RecyclableObject *const thisObject = UnsafeVarTo<RecyclableObject>(thisInstance);

            if (!Root && Method && (propertyId == PropertyIds::apply || propertyId == PropertyIds::call) && VarIs<ScriptFunction>(object))
            {
                // If the property being loaded is "apply"/"call", make an optimistic assumption that apply/call is not overridden and
                // undefer the function right here if it was defer parsed before. This is required so that the load of "apply"/"call"
                // happens from the same "type". Otherwise, we will have a polymorphic cache for load of "apply"/"call".
                ScriptFunction *fn = UnsafeVarTo<ScriptFunction>(object);
                if (fn->GetType()->GetEntryPoint() == JavascriptFunction::DeferredParsingThunk)
                {
                    JavascriptFunction::DeferredParse(&fn);
                }
            }

            PropertyCacheOperationInfo operationInfo;
            PropertyValueInfo propertyValueInfo;
            PropertyValueInfo::SetCacheInfo(&propertyValueInfo, functionBody, inlineCache, inlineCacheIndex, true);
            if (!CacheOperators::TryGetProperty<true, true, true, !Root && !Method, true, !Root, true, false, true, false>(
                    object,
                    Root,
                    object,
                    propertyId,
                    &value,
                    scriptContext,
                    &operationInfo,
                    &propertyValueInfo))
            {
                const auto PatchGetValue = &JavascriptOperators::PatchGetValueWithThisPtrNoFastPath;
                const auto PatchGetRootValue = &JavascriptOperators::PatchGetRootValueNoFastPath_Var;
                const auto PatchGetMethod = &JavascriptOperators::PatchGetMethodNoFastPath;
                const auto PatchGetRootMethod = &JavascriptOperators::PatchGetRootMethodNoFastPath_Var;
                const auto PatchGet =
                    Root
                        ? Method ? PatchGetRootMethod : PatchGetRootValue
                        : PatchGetMethod ;
                value = (!Root && !Method) ? PatchGetValue(functionBody, inlineCache, inlineCacheIndex, object, propertyId, thisObject) :
                    PatchGet(functionBody, inlineCache, inlineCacheIndex, object, propertyId);
                CacheOperators::PretendTryGetProperty<true, false>(object->GetType(), &operationInfo, &propertyValueInfo);
            }
            else if (!Root && !Method)
            {
                // Inline cache hit. oldflags must match the new ones. If not there is mark it as polymorphic as there is likely
                // a bailout to interpreter and change in the inline cache type.
                const FldInfoFlags oldflags = dynamicProfileInfo->GetFldInfo(functionBody, inlineCacheIndex)->flags;
                if ((oldflags != FldInfo_NoInfo) &&
                    !(oldflags & DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType)))
                {
                    fldInfoFlags = DynamicProfileInfo::MergeFldInfoFlags(fldInfoFlags, FldInfo_Polymorphic);
                }
            }

            if (!Root && operationInfo.isPolymorphic)
            {
                fldInfoFlags = DynamicProfileInfo::MergeFldInfoFlags(fldInfoFlags, FldInfo_Polymorphic);
            }
            fldInfoFlags =
                DynamicProfileInfo::MergeFldInfoFlags(
                    fldInfoFlags,
                    DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType));
            fldInfoFlags =
                DynamicProfileInfo::MergeFldInfoFlags(
                    fldInfoFlags,
                    DynamicProfileInfo::FldInfoFlagsFromSlotType(operationInfo.slotType));

            if (!Method)
            {
                UpdateFldInfoFlagsForGetSetInlineCandidate(
                    object,
                    fldInfoFlags,
                    operationInfo.cacheType,
                    inlineCache,
                    functionBody);
                if (!Root && CallApplyTarget)
                {
                    UpdateFldInfoFlagsForCallApplyInlineCandidate(
                        object,
                        fldInfoFlags,
                        operationInfo.cacheType,
                        inlineCache,
                        functionBody);
                }
            }
        }
        else
        {
            Assert(!Root);
            const auto PatchGetValue = &JavascriptOperators::PatchGetValue<false, InlineCache>;
            const auto PatchGetMethod = &JavascriptOperators::PatchGetMethod<false, InlineCache>;
            const auto PatchGet = Method ? PatchGetMethod : PatchGetValue;
            value = PatchGet(functionBody, inlineCache, inlineCacheIndex, instance, propertyId);
        }

        dynamicProfileInfo->RecordFieldAccess(functionBody, inlineCacheIndex, value, fldInfoFlags);
        return value;
    }